

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usprep.cpp
# Opt level: O2

int32_t usprep_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                      UErrorCode *pErrorCode)

{
  void *__src;
  byte bVar1;
  int32_t iVar2;
  int32_t iVar3;
  void *__dest;
  char *fmt;
  int iVar4;
  long lVar5;
  int32_t indexes [16];
  
  iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (pErrorCode == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  bVar1 = *(byte *)((long)inData + 0xd);
  if ((((bVar1 != 0x50 || *(byte *)((long)inData + 0xc) != 0x53) ||
       (bVar1 = 0x50, *(char *)((long)inData + 0xe) != 'R')) ||
      (*(char *)((long)inData + 0xf) != 'P')) || (*(char *)((long)inData + 0x10) != '\x03')) {
    udata_printError_63(ds,
                        "usprep_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as StringPrep .spp data\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)bVar1,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  if ((length < 0) || (length = length - iVar2, 0x3f < length)) {
    __src = (void *)((long)inData + (long)iVar2);
    __dest = (void *)((long)iVar2 + (long)outData);
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      iVar3 = udata_readInt32_63(ds,*(int32_t *)((long)__src + lVar5 * 4));
      indexes[lVar5] = iVar3;
    }
    lVar5 = (long)indexes[0] + 0x40;
    iVar4 = (int)lVar5 + indexes[1];
    if (-1 < length) {
      if (length < iVar4) {
        fmt = "usprep_swap(): too few bytes (%d after header) for all of StringPrep .spp data\n";
        goto LAB_002dfe16;
      }
      if (inData != outData) {
        memcpy(__dest,__src,(long)iVar4);
      }
      (*ds->swapArray32)(ds,__src,0x40,__dest,pErrorCode);
      utrie_swap_63(ds,(void *)((long)__src + 0x40),indexes[0],(void *)((long)__dest + 0x40),
                    pErrorCode);
      (*ds->swapArray16)(ds,(void *)((long)__src + lVar5),indexes[1],(void *)((long)__dest + lVar5),
                         pErrorCode);
    }
    iVar2 = iVar4 + iVar2;
  }
  else {
    fmt = "usprep_swap(): too few bytes (%d after header) for StringPrep .spp data\n";
LAB_002dfe16:
    iVar2 = 0;
    udata_printError_63(ds,fmt,(ulong)(uint)length);
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
usprep_swap(const UDataSwapper *ds,
            const void *inData, int32_t length, void *outData,
            UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    const int32_t *inIndexes;
    int32_t indexes[16];

    int32_t i, offset, count, size;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x53 &&   /* dataFormat="SPRP" */
        pInfo->dataFormat[1]==0x50 &&
        pInfo->dataFormat[2]==0x52 &&
        pInfo->dataFormat[3]==0x50 &&
        pInfo->formatVersion[0]==3
    )) {
        udata_printError(ds, "usprep_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as StringPrep .spp data\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    inIndexes=(const int32_t *)inBytes;

    if(length>=0) {
        length-=headerSize;
        if(length<16*4) {
            udata_printError(ds, "usprep_swap(): too few bytes (%d after header) for StringPrep .spp data\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    /* read the first 16 indexes (ICU 2.8/format version 3: _SPREP_INDEX_TOP==16, might grow) */
    for(i=0; i<16; ++i) {
        indexes[i]=udata_readInt32(ds, inIndexes[i]);
    }

    /* calculate the total length of the data */
    size=
        16*4+ /* size of indexes[] */
        indexes[_SPREP_INDEX_TRIE_SIZE]+
        indexes[_SPREP_INDEX_MAPPING_DATA_SIZE];

    if(length>=0) {
        if(length<size) {
            udata_printError(ds, "usprep_swap(): too few bytes (%d after header) for all of StringPrep .spp data\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        /* copy the data for inaccessible bytes */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, size);
        }

        offset=0;

        /* swap the int32_t indexes[] */
        count=16*4;
        ds->swapArray32(ds, inBytes, count, outBytes, pErrorCode);
        offset+=count;

        /* swap the UTrie */
        count=indexes[_SPREP_INDEX_TRIE_SIZE];
        utrie_swap(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        offset+=count;

        /* swap the uint16_t mappingTable[] */
        count=indexes[_SPREP_INDEX_MAPPING_DATA_SIZE];
        ds->swapArray16(ds, inBytes+offset, count, outBytes+offset, pErrorCode);
        //offset+=count;
    }

    return headerSize+size;
}